

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>::invoke
          (result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  const_iterator rollback;
  bool bVar1;
  const_iterator other;
  long lVar2;
  region retval;
  result<toml::detail::region,_toml::detail::none_t> rslt;
  
  region::region(&retval,loc);
  rollback._M_current = (loc->iter_)._M_current;
  lVar2 = 3;
  do {
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) {
      region::region((region *)&rslt,&retval);
      result<toml::detail::region,_toml::detail::none_t>::result
                (__return_storage_ptr__,(success_type *)&rslt);
      region::~region((region *)&rslt);
      break;
    }
    in_range<'0',_'9'>::invoke(&rslt,loc);
    bVar1 = rslt.is_ok_;
    if (rslt.is_ok_ == false) {
      other._M_current = rollback._M_current;
      location::reset(loc,rollback);
      __return_storage_ptr__->is_ok_ = false;
    }
    else {
      other._M_current = (char *)result<toml::detail::region,_toml::detail::none_t>::unwrap(&rslt);
      region::operator+=(&retval,(region *)other._M_current);
    }
    result<toml::detail::region,_toml::detail::none_t>::cleanup
              (&rslt,(EVP_PKEY_CTX *)other._M_current);
  } while (bVar1 != false);
  region::~region(&retval);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        region retval(loc);
        const auto first = loc.iter();
        for(std::size_t i=0; i<N; ++i)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                loc.reset(first);
                return none();
            }
            retval += rslt.unwrap();
        }
        return ok(std::move(retval));
    }